

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::LegacyReporterAdapter::assertionEnded
          (LegacyReporterAdapter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  OfType OVar2;
  pointer pMVar3;
  char *macroName;
  IReporter *pIVar4;
  undefined1 local_390 [8];
  AssertionResult result;
  undefined1 local_2c8 [8];
  ResultBuilder rb;
  const_iterator itEnd;
  const_iterator it;
  AssertionStats *assertionStats_local;
  LegacyReporterAdapter *this_local;
  
  OVar2 = AssertionResult::getResultType(&assertionStats->assertionResult);
  if (OVar2 != Ok) {
    itEnd = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                      (&assertionStats->infoMessages);
    rb._664_8_ = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                           (&assertionStats->infoMessages);
    while (bVar1 = __gnu_cxx::operator!=
                             (&itEnd,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                      *)&rb.m_shouldDebugBreak), bVar1) {
      pMVar3 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator->(&itEnd);
      if (pMVar3->type == Info) {
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator->(&itEnd);
        macroName = (char *)std::__cxx11::string::c_str();
        pMVar3 = __gnu_cxx::
                 __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                 ::operator->(&itEnd);
        ResultBuilder::ResultBuilder
                  ((ResultBuilder *)local_2c8,macroName,&pMVar3->lineInfo,"",Normal);
        pMVar3 = __gnu_cxx::
                 __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                 ::operator->(&itEnd);
        ResultBuilder::operator<<((ResultBuilder *)local_2c8,&pMVar3->message);
        ResultBuilder::setResultType((ResultBuilder *)local_2c8,Info);
        ResultBuilder::build((AssertionResult *)local_390,(ResultBuilder *)local_2c8);
        pIVar4 = Ptr<Catch::IReporter>::operator->(&this->m_legacyReporter);
        (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar4,local_390);
        AssertionResult::~AssertionResult((AssertionResult *)local_390);
        ResultBuilder::~ResultBuilder((ResultBuilder *)local_2c8);
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
      ::operator++(&itEnd);
    }
  }
  pIVar4 = Ptr<Catch::IReporter>::operator->(&this->m_legacyReporter);
  (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
            (pIVar4,&assertionStats->assertionResult);
  return true;
}

Assistant:

bool LegacyReporterAdapter::assertionEnded( AssertionStats const& assertionStats ) {
        if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
            for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                    it != itEnd;
                    ++it ) {
                if( it->type == ResultWas::Info ) {
                    ResultBuilder rb( it->macroName.c_str(), it->lineInfo, "", ResultDisposition::Normal );
                    rb << it->message;
                    rb.setResultType( ResultWas::Info );
                    AssertionResult result = rb.build();
                    m_legacyReporter->Result( result );
                }
            }
        }
        m_legacyReporter->Result( assertionStats.assertionResult );
        return true;
    }